

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O2

char * __thiscall google::protobuf::Value::_InternalParse(Value *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  Struct *msg;
  string *s;
  uint64 uVar3;
  ListValue *msg_00;
  UnknownFieldSet *unknown;
  char cVar4;
  ulong tag_00;
  uint local_3c;
  double *pdStack_38;
  uint32 tag;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pdStack_38 = (double *)ptr;
  do {
    bVar2 = internal::ParseContext::Done(ctx,(char **)&stack0xffffffffffffffc8);
    if (bVar2) {
      return (char *)pdStack_38;
    }
    pdStack_38 = (double *)internal::ReadTag((char *)pdStack_38,&local_3c,0);
    if (pdStack_38 == (double *)0x0) {
      return (char *)0x0;
    }
    tag_00 = (ulong)local_3c;
    cVar4 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar4 != '\b') break;
      uVar3 = internal::ReadVarint64((char **)&stack0xffffffffffffffc8);
      if (pdStack_38 == (double *)0x0) {
        return (char *)0x0;
      }
      _internal_set_null_value(this,(NullValue)uVar3);
LAB_0030a689:
      cVar4 = '\x02';
      goto LAB_0030a6ec;
    case 2:
      if (cVar4 == '\x11') {
        _internal_set_number_value(this,*pdStack_38);
        pdStack_38 = pdStack_38 + 1;
        goto LAB_0030a689;
      }
      break;
    case 3:
      if (cVar4 == '\x1a') {
        s = _internal_mutable_string_value_abi_cxx11_(this);
        pdStack_38 = (double *)internal::InlineGreedyStringParser(s,(char *)pdStack_38,ctx);
        bVar2 = internal::VerifyUTF8(s,"google.protobuf.Value.string_value");
        if (!bVar2) {
          return (char *)0x0;
        }
        cVar4 = (pdStack_38 == (double *)0x0) * '\x02' + '\x02';
        goto LAB_0030a6ec;
      }
      break;
    case 4:
      if (cVar4 == ' ') {
        uVar3 = internal::ReadVarint64((char **)&stack0xffffffffffffffc8);
        _internal_set_bool_value(this,uVar3 != 0);
        cVar4 = '\x02';
        if (pdStack_38 == (double *)0x0) {
          return (char *)0x0;
        }
        goto LAB_0030a6ec;
      }
      break;
    case 5:
      if (cVar4 != '*') break;
      msg = _internal_mutable_struct_value(this);
      pdStack_38 = (double *)
                   internal::ParseContext::ParseMessage<google::protobuf::Struct>
                             (ctx,msg,(char *)pdStack_38);
      goto LAB_0030a6e0;
    case 6:
      if (cVar4 == '2') {
        msg_00 = _internal_mutable_list_value(this);
        pdStack_38 = (double *)
                     internal::ParseContext::ParseMessage<google::protobuf::ListValue>
                               (ctx,msg_00,(char *)pdStack_38);
        goto LAB_0030a6e0;
      }
    }
    if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return (char *)pdStack_38;
    }
    pvVar1 = this_00->ptr_;
    if (((ulong)pvVar1 & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
    }
    pdStack_38 = (double *)internal::UnknownFieldParse(tag_00,unknown,(char *)pdStack_38,ctx);
LAB_0030a6e0:
    cVar4 = '\x02';
    if (pdStack_38 == (double *)0x0) {
      return (char *)0x0;
    }
LAB_0030a6ec:
    if (cVar4 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Value::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // .google.protobuf.NullValue null_value = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_null_value(static_cast<PROTOBUF_NAMESPACE_ID::NullValue>(val));
        } else goto handle_unusual;
        continue;
      // double number_value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 17)) {
          _internal_set_number_value(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // string string_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_string_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Value.string_value"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bool bool_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _internal_set_bool_value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Struct struct_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_struct_value(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.ListValue list_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr = ctx->ParseMessage(_internal_mutable_list_value(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}